

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O0

void __thiscall libDAI::TFactor<double>::TFactor(TFactor<double> *this,TFactor<double> *x)

{
  VarSet *in_RDI;
  VarSet *in_stack_ffffffffffffffe0;
  
  VarSet::VarSet(in_stack_ffffffffffffffe0,in_RDI);
  TProb<double>::TProb((TProb<double> *)in_stack_ffffffffffffffe0,(TProb<double> *)in_RDI);
  return;
}

Assistant:

TFactor( const TFactor<T> &x ) : _vs(x._vs), _p(x._p) {}